

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O2

FL_BLINE * __thiscall Fl_Browser::find_line(Fl_Browser *this,int line)

{
  int iVar1;
  long lVar2;
  FL_BLINE **ppFVar3;
  FL_BLINE *pFVar4;
  int iVar5;
  
  iVar5 = this->cacheline;
  if (iVar5 == line) {
    return this->cache;
  }
  iVar1 = this->lines;
  if (((iVar5 == 0) || (line <= iVar5 / 2)) || (lVar2 = 0x278, (iVar1 + iVar5) / 2 <= line)) {
    lVar2 = (ulong)(iVar1 / 2 < line) * 8 + 0x268;
    iVar5 = 1;
    if (iVar1 / 2 < line) {
      iVar5 = iVar1;
    }
  }
  ppFVar3 = (FL_BLINE **)
            ((long)&(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget + lVar2
            );
  while ((pFVar4 = *ppFVar3, iVar5 < line && (pFVar4 != (FL_BLINE *)0x0))) {
    iVar5 = iVar5 + 1;
    ppFVar3 = &pFVar4->next;
  }
  for (; (line < iVar5 && (pFVar4 != (FL_BLINE *)0x0)); pFVar4 = pFVar4->prev) {
    iVar5 = iVar5 + -1;
  }
  this->cacheline = line;
  this->cache = pFVar4;
  return pFVar4;
}

Assistant:

FL_BLINE* Fl_Browser::find_line(int line) const {
  int n; FL_BLINE* l;
  if (line == cacheline) return cache;
  if (cacheline && line > (cacheline/2) && line < ((cacheline+lines)/2)) {
    n = cacheline; l = cache;
  } else if (line <= (lines/2)) {
    n = 1; l = first;
  } else {
    n = lines; l = last;
  }
  for (; n < line && l; n++) l = l->next;
  for (; n > line && l; n--) l = l->prev;
  ((Fl_Browser*)this)->cacheline = line;
  ((Fl_Browser*)this)->cache = l;
  return l;
}